

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_sub(sexp ctx,sexp a,sexp b)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  sexp psVar13;
  sexp a_00;
  sexp in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp tmp2;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp tmp1;
  sexp r;
  int bt;
  int at;
  int negatep;
  sexp in_stack_ffffffffffffff48;
  sexp in_stack_ffffffffffffff50;
  sexp psVar14;
  sexp in_stack_ffffffffffffff58;
  sexp in_stack_ffffffffffffff60;
  sexp in_stack_ffffffffffffff68;
  sexp in_stack_ffffffffffffff70;
  sexp in_stack_ffffffffffffff78;
  sexp in_stack_ffffffffffffff80;
  sexp in_stack_ffffffffffffff88;
  sexp in_stack_ffffffffffffff90;
  sexp local_50;
  undefined1 local_48 [72];
  
  local_48._44_4_ = 0;
  local_48._48_8_ = in_RDX;
  local_48._56_8_ = in_RSI;
  local_48._64_8_ = in_RDI;
  local_48._40_4_ = sexp_number_type(in_RSI);
  local_48._36_4_ = sexp_number_type((sexp)local_48._48_8_);
  local_48._24_8_ = &DAT_0000043e;
  local_48._16_8_ = &DAT_0000043e;
  memset(local_48,0,0x10);
  local_50 = (sexp)0x43e;
  memset(&stack0xffffffffffffffa0,0,0x10);
  uVar12 = local_48._56_8_;
  local_48._0_8_ = local_48 + 0x10;
  local_48._8_8_ =
       (((anon_union_24768_35_b8e82fc1_for_value *)(local_48._64_8_ + 8))->context).saves;
  (((anon_union_24768_35_b8e82fc1_for_value *)(local_48._64_8_ + 8))->context).saves =
       (sexp_gc_var_t *)local_48;
  psVar14 = (sexp)&local_50;
  (((anon_union_24768_35_b8e82fc1_for_value *)(local_48._64_8_ + 8))->context).saves =
       (sexp_gc_var_t *)&stack0xffffffffffffffa0;
  a_00 = (sexp)(ulong)(uint)(local_48._36_4_ + local_48._40_4_ * 6);
  switch(a_00) {
  case (sexp)0x0:
  case (sexp)0x1:
  case (sexp)0x2:
  case (sexp)0x3:
  case (sexp)0x4:
  case (sexp)0x5:
    local_48._24_8_ =
         sexp_type_exception(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                             (sexp_uint_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case (sexp)0x6:
  case (sexp)0xc:
  case (sexp)0x12:
  case (sexp)0x18:
  case (sexp)0x1e:
    local_48._24_8_ =
         sexp_type_exception(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                             (sexp_uint_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case (sexp)0x7:
    local_48._24_8_ = local_48._56_8_ + (1 - local_48._48_8_);
    break;
  case (sexp)0x8:
    local_48._24_8_ = sexp_make_flonum(in_stack_ffffffffffffff58,(double)in_stack_ffffffffffffff50);
    break;
  case (sexp)0x9:
    local_48._16_8_ = sexp_fixnum_to_bignum(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    local_48._24_8_ =
         sexp_bignum_sub(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                         in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if (((local_48._24_8_ & 3) == 0) && (((sexp)local_48._24_8_)->tag == 0xc)) {
      (((sexp)local_48._24_8_)->value).flonum_bits[0] =
           -(((sexp)local_48._24_8_)->value).flonum_bits[0];
    }
    else if ((local_48._24_8_ & 1) == 1) {
      auVar2._8_8_ = (long)local_48._24_8_ >> 0x3f;
      auVar2._0_8_ = local_48._24_8_ & 0xfffffffffffffffe;
      local_48._24_8_ = SUB168(auVar2 / SEXT816(2),0) * -2 | 1;
    }
    local_48._24_8_ = sexp_bignum_normalize(in_stack_ffffffffffffff48);
    break;
  case (sexp)0xd:
    local_48._24_8_ = sexp_make_flonum(in_stack_ffffffffffffff58,(double)in_stack_ffffffffffffff50);
    break;
  case (sexp)0xe:
    local_48._24_8_ = sexp_make_flonum(in_stack_ffffffffffffff58,(double)in_stack_ffffffffffffff50);
    break;
  case (sexp)0xf:
    sexp_bignum_to_double(in_stack_ffffffffffffff60);
    local_48._24_8_ = sexp_make_flonum(in_stack_ffffffffffffff58,(double)in_stack_ffffffffffffff50);
    break;
  case (sexp)0x10:
    sexp_ratio_to_double(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_48._24_8_ = sexp_make_flonum(in_stack_ffffffffffffff58,(double)in_stack_ffffffffffffff50);
    break;
  case (sexp)0x13:
    local_48._16_8_ = sexp_fixnum_to_bignum(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    sexp_bignum_sub(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff58);
    local_48._24_8_ = sexp_bignum_normalize(in_stack_ffffffffffffff48);
    break;
  case (sexp)0x14:
    sexp_bignum_to_double(in_stack_ffffffffffffff60);
    local_48._24_8_ = sexp_make_flonum(in_stack_ffffffffffffff58,(double)in_stack_ffffffffffffff50);
    break;
  case (sexp)0x15:
    sexp_bignum_sub(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff58);
    local_48._24_8_ = sexp_bignum_normalize(in_stack_ffffffffffffff48);
    break;
  case (sexp)0x19:
  case (sexp)0x1b:
    local_48._16_8_ = local_48._56_8_;
    local_48._56_8_ = local_48._48_8_;
    local_48._48_8_ = uVar12;
    local_48._44_4_ = 1;
  case (sexp)0xa:
  case (sexp)0x16:
    local_48._16_8_ =
         sexp_make_ratio(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                         in_stack_ffffffffffffff50);
    local_48._56_8_ = local_48._16_8_;
  case (sexp)0x1c:
    local_50 = sexp_make_ratio(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                               in_stack_ffffffffffffff50);
    if ((((local_50->value).stack.length & 3) == 0) && (((local_50->value).type.name)->tag == 0xc))
    {
      psVar13 = sexp_copy_bignum(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                 in_stack_ffffffffffffff60,(sexp_uint_t)in_stack_ffffffffffffff58);
      (local_50->value).type.name = psVar13;
    }
    if ((((local_50->value).stack.length & 3) == 0) && (((local_50->value).type.name)->tag == 0xc))
    {
      (((local_50->value).type.name)->value).flonum_bits[0] =
           -(((local_50->value).type.name)->value).flonum_bits[0];
    }
    else if (((local_50->value).stack.length & 1) == 1) {
      uVar1 = (local_50->value).stack.length;
      auVar3._8_8_ = (long)uVar1 >> 0x3f;
      auVar3._0_8_ = uVar1 & 0xfffffffffffffffe;
      (local_50->value).stack.length = SUB168(auVar3 / SEXT816(2),0) * -2 | 1;
    }
    local_48._24_8_ = sexp_ratio_add(psVar14,a_00,in_stack_ffffffffffffff90);
    if (local_48._44_4_ != 0) {
      if (((local_48._24_8_ & 3) == 0) && (((sexp)local_48._24_8_)->tag == 0xd)) {
        if ((((((sexp)local_48._24_8_)->value).stack.length & 3) == 0) &&
           (((((sexp)local_48._24_8_)->value).type.name)->tag == 0xc)) {
          (((((sexp)local_48._24_8_)->value).type.name)->value).flonum_bits[0] =
               -(((((sexp)local_48._24_8_)->value).type.name)->value).flonum_bits[0];
        }
        else if (((((sexp)local_48._24_8_)->value).stack.length & 1) == 1) {
          uVar1 = (((sexp)local_48._24_8_)->value).stack.length;
          auVar4._8_8_ = (long)uVar1 >> 0x3f;
          auVar4._0_8_ = uVar1 & 0xfffffffffffffffe;
          (((sexp)local_48._24_8_)->value).stack.length = SUB168(auVar4 / SEXT816(2),0) * -2 | 1;
        }
      }
      else if (((local_48._24_8_ & 3) == 0) && (((sexp)local_48._24_8_)->tag == 0xb)) {
        (((sexp)local_48._24_8_)->value).stack.length =
             (((sexp)local_48._24_8_)->value).stack.length ^ 0x8000000000000000;
      }
      else if (((local_48._24_8_ & 3) == 0) && (((sexp)local_48._24_8_)->tag == 0xc)) {
        (((sexp)local_48._24_8_)->value).flonum_bits[0] =
             -(((sexp)local_48._24_8_)->value).flonum_bits[0];
      }
      else if ((local_48._24_8_ & 1) == 1) {
        auVar5._8_8_ = (long)local_48._24_8_ >> 0x3f;
        auVar5._0_8_ = local_48._24_8_ & 0xfffffffffffffffe;
        local_48._24_8_ = SUB168(auVar5 / SEXT816(2),0) * -2 | 1;
      }
    }
    break;
  case (sexp)0x1a:
    psVar14 = (sexp)local_48._64_8_;
    sexp_ratio_to_double(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_48._24_8_ = sexp_make_flonum(psVar14,(double)in_stack_ffffffffffffff50);
    break;
  case (sexp)0x1d:
    psVar14 = (sexp)local_48._64_8_;
    sexp_ratio_to_double(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_48._16_8_ = sexp_make_flonum(in_stack_ffffffffffffff58,(double)psVar14);
    local_48._56_8_ = local_48._16_8_;
    goto LAB_0012b48e;
  case (sexp)0x22:
    sexp_ratio_to_double(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_48._48_8_ = sexp_make_flonum(in_stack_ffffffffffffff58,(double)in_stack_ffffffffffffff50);
  case (sexp)0x1f:
  case (sexp)0x20:
  case (sexp)0x21:
    uVar12 = local_48._56_8_;
    local_48._16_8_ = local_48._56_8_;
    local_48._56_8_ = local_48._48_8_;
    local_48._48_8_ = uVar12;
    local_48._44_4_ = 1;
  case (sexp)0xb:
  case (sexp)0x11:
  case (sexp)0x17:
    local_48._16_8_ =
         sexp_make_complex(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                           in_stack_ffffffffffffff50);
    local_48._56_8_ = local_48._16_8_;
  case (sexp)0x23:
LAB_0012b48e:
    local_48._24_8_ =
         sexp_complex_sub(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                          in_stack_ffffffffffffff70);
    if (local_48._44_4_ != 0) {
      if (((local_48._24_8_ & 3) == 0) && (((sexp)local_48._24_8_)->tag == 0xe)) {
        local_48._24_8_ = sexp_complex_copy(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        if ((((((sexp)local_48._24_8_)->value).stack.length & 3) == 0) &&
           (((((sexp)local_48._24_8_)->value).type.name)->tag == 0xd)) {
          if ((((((((sexp)local_48._24_8_)->value).type.name)->value).stack.length & 3) == 0) &&
             (((((((sexp)local_48._24_8_)->value).type.name)->value).type.name)->tag == 0xc)) {
            (((((((sexp)local_48._24_8_)->value).type.name)->value).type.name)->value).flonum_bits
            [0] = -(((((((sexp)local_48._24_8_)->value).type.name)->value).type.name)->value).
                   flonum_bits[0];
          }
          else if (((((((sexp)local_48._24_8_)->value).type.name)->value).stack.length & 1) == 1) {
            uVar1 = (((((sexp)local_48._24_8_)->value).type.name)->value).stack.length;
            auVar6._8_8_ = (long)uVar1 >> 0x3f;
            auVar6._0_8_ = uVar1 & 0xfffffffffffffffe;
            (((((sexp)local_48._24_8_)->value).type.name)->value).stack.length =
                 SUB168(auVar6 / SEXT816(2),0) * -2 | 1;
          }
        }
        else if ((((((sexp)local_48._24_8_)->value).stack.length & 3) == 0) &&
                (((((sexp)local_48._24_8_)->value).type.name)->tag == 0xb)) {
          (((((sexp)local_48._24_8_)->value).type.name)->value).stack.length =
               (((((sexp)local_48._24_8_)->value).type.name)->value).stack.length ^
               0x8000000000000000;
        }
        else if ((((((sexp)local_48._24_8_)->value).stack.length & 3) == 0) &&
                (((((sexp)local_48._24_8_)->value).type.name)->tag == 0xc)) {
          (((((sexp)local_48._24_8_)->value).type.name)->value).flonum_bits[0] =
               -(((((sexp)local_48._24_8_)->value).type.name)->value).flonum_bits[0];
        }
        else if (((((sexp)local_48._24_8_)->value).stack.length & 1) == 1) {
          uVar1 = (((sexp)local_48._24_8_)->value).stack.length;
          auVar7._8_8_ = (long)uVar1 >> 0x3f;
          auVar7._0_8_ = uVar1 & 0xfffffffffffffffe;
          (((sexp)local_48._24_8_)->value).stack.length = SUB168(auVar7 / SEXT816(2),0) * -2 | 1;
        }
        if ((((((sexp)local_48._24_8_)->value).string.offset & 3) == 0) &&
           (((((sexp)local_48._24_8_)->value).type.cpl)->tag == 0xd)) {
          if ((((((((sexp)local_48._24_8_)->value).type.cpl)->value).stack.length & 3) == 0) &&
             (((((((sexp)local_48._24_8_)->value).type.cpl)->value).type.name)->tag == 0xc)) {
            (((((((sexp)local_48._24_8_)->value).type.cpl)->value).type.name)->value).flonum_bits[0]
                 = -(((((((sexp)local_48._24_8_)->value).type.cpl)->value).type.name)->value).
                    flonum_bits[0];
          }
          else if (((((((sexp)local_48._24_8_)->value).type.cpl)->value).stack.length & 1) == 1) {
            uVar1 = (((((sexp)local_48._24_8_)->value).type.cpl)->value).stack.length;
            auVar8._8_8_ = (long)uVar1 >> 0x3f;
            auVar8._0_8_ = uVar1 & 0xfffffffffffffffe;
            (((((sexp)local_48._24_8_)->value).type.cpl)->value).stack.length =
                 SUB168(auVar8 / SEXT816(2),0) * -2 | 1;
          }
        }
        else if ((((((sexp)local_48._24_8_)->value).string.offset & 3) == 0) &&
                (((((sexp)local_48._24_8_)->value).type.cpl)->tag == 0xb)) {
          (((((sexp)local_48._24_8_)->value).type.cpl)->value).stack.length =
               (((((sexp)local_48._24_8_)->value).type.cpl)->value).stack.length ^
               0x8000000000000000;
        }
        else if ((((((sexp)local_48._24_8_)->value).string.offset & 3) == 0) &&
                (((((sexp)local_48._24_8_)->value).type.cpl)->tag == 0xc)) {
          (((((sexp)local_48._24_8_)->value).type.cpl)->value).flonum_bits[0] =
               -(((((sexp)local_48._24_8_)->value).type.cpl)->value).flonum_bits[0];
        }
        else if (((((sexp)local_48._24_8_)->value).string.offset & 1) == 1) {
          uVar1 = (((sexp)local_48._24_8_)->value).fileno.fd;
          auVar9._8_8_ = (long)uVar1 >> 0x3f;
          auVar9._0_8_ = uVar1 & 0xfffffffffffffffe;
          (((sexp)local_48._24_8_)->value).string.offset = SUB168(auVar9 / SEXT816(2),0) * -2 | 1;
        }
      }
      else if (((local_48._24_8_ & 3) == 0) && (((sexp)local_48._24_8_)->tag == 0xd)) {
        if ((((((sexp)local_48._24_8_)->value).stack.length & 3) == 0) &&
           (((((sexp)local_48._24_8_)->value).type.name)->tag == 0xc)) {
          (((((sexp)local_48._24_8_)->value).type.name)->value).flonum_bits[0] =
               -(((((sexp)local_48._24_8_)->value).type.name)->value).flonum_bits[0];
        }
        else if (((((sexp)local_48._24_8_)->value).stack.length & 1) == 1) {
          uVar1 = (((sexp)local_48._24_8_)->value).stack.length;
          auVar10._8_8_ = (long)uVar1 >> 0x3f;
          auVar10._0_8_ = uVar1 & 0xfffffffffffffffe;
          (((sexp)local_48._24_8_)->value).stack.length = SUB168(auVar10 / SEXT816(2),0) * -2 | 1;
        }
      }
      else if (((local_48._24_8_ & 3) == 0) && (((sexp)local_48._24_8_)->tag == 0xb)) {
        (((sexp)local_48._24_8_)->value).stack.length =
             (((sexp)local_48._24_8_)->value).stack.length ^ 0x8000000000000000;
      }
      else if (((local_48._24_8_ & 3) == 0) && (((sexp)local_48._24_8_)->tag == 0xc)) {
        (((sexp)local_48._24_8_)->value).flonum_bits[0] =
             -(((sexp)local_48._24_8_)->value).flonum_bits[0];
      }
      else if ((local_48._24_8_ & 1) == 1) {
        auVar11._8_8_ = (long)local_48._24_8_ >> 0x3f;
        auVar11._0_8_ = local_48._24_8_ & 0xfffffffffffffffe;
        local_48._24_8_ = SUB168(auVar11 / SEXT816(2),0) * -2 | 1;
      }
    }
  }
  (((anon_union_24768_35_b8e82fc1_for_value *)(local_48._64_8_ + 8))->context).saves =
       (sexp_gc_var_t *)local_48._8_8_;
  return (sexp)local_48._24_8_;
}

Assistant:

sexp sexp_sub (sexp ctx, sexp a, sexp b) {
#if SEXP_USE_FLONUMS
  int negatep=0;
#endif
  int at=sexp_number_type(a), bt=sexp_number_type(b);
  sexp r=SEXP_VOID;
  sexp_gc_var2(tmp1, tmp2);
  sexp_gc_preserve2(ctx, tmp1, tmp2);
  switch ((at * SEXP_NUM_NUMBER_TYPES) + bt) {
  case SEXP_NUM_NOT_NOT: case SEXP_NUM_NOT_FIX:
  case SEXP_NUM_NOT_FLO: case SEXP_NUM_NOT_BIG:
#if SEXP_USE_RATIOS
  case SEXP_NUM_NOT_RAT:
#endif
#if SEXP_USE_COMPLEX
  case SEXP_NUM_NOT_CPX:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, a);
    break;
  case SEXP_NUM_FIX_NOT: case SEXP_NUM_FLO_NOT: case SEXP_NUM_BIG_NOT:
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_NOT:
#endif
#if SEXP_USE_COMPLEX
  case SEXP_NUM_CPX_NOT:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, b);
    break;
  case SEXP_NUM_FIX_FIX:
    r = sexp_fx_sub(a, b);      /* VM catches this case */
    break;
  case SEXP_NUM_FIX_FLO:
    r = sexp_make_flonum(ctx, a==SEXP_ZERO ? -sexp_flonum_value(b) : sexp_fixnum_to_double(a)-sexp_flonum_value(b));
    break;
  case SEXP_NUM_FIX_BIG:
    tmp1 = sexp_fixnum_to_bignum(ctx, a);
    r = sexp_bignum_sub(ctx, NULL, b, tmp1);
    sexp_negate_exact(r);
    r = sexp_bignum_normalize(r);
    break;
  case SEXP_NUM_FLO_FIX:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) - sexp_fixnum_to_double(b));
    break;
  case SEXP_NUM_FLO_FLO:
    r = sexp_fp_sub(ctx, a, b);
    break;
  case SEXP_NUM_FLO_BIG:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) - sexp_bignum_to_double(b));
    break;
  case SEXP_NUM_BIG_FIX:
    tmp1 = sexp_fixnum_to_bignum(ctx, b);
    r = sexp_bignum_normalize(sexp_bignum_sub(ctx, NULL, a, tmp1));
    break;
  case SEXP_NUM_BIG_FLO:
    r = sexp_make_flonum(ctx, sexp_bignum_to_double(a) - sexp_flonum_value(b));
    break;
  case SEXP_NUM_BIG_BIG:
    r = sexp_bignum_normalize(sexp_bignum_sub(ctx, NULL, a, b));
    break;
#if SEXP_USE_RATIOS
  case SEXP_NUM_FLO_RAT:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) - sexp_ratio_to_double(ctx, b));
    break;
  case SEXP_NUM_RAT_FLO:
    r = sexp_make_flonum(ctx, sexp_ratio_to_double(ctx, a) - sexp_flonum_value(b));
    break;
  case SEXP_NUM_RAT_FIX:
  case SEXP_NUM_RAT_BIG:
    tmp1 = a; a = b; b = tmp1;
    negatep = 1;
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_FIX_RAT:
  case SEXP_NUM_BIG_RAT:
    a = tmp1 = sexp_make_ratio(ctx, a, SEXP_ONE);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_RAT_RAT:
    tmp2 = sexp_make_ratio(ctx, sexp_ratio_numerator(b), sexp_ratio_denominator(b));
    if (sexp_bignump(sexp_ratio_numerator(tmp2)))
      sexp_ratio_numerator(tmp2) = sexp_copy_bignum(ctx, NULL, sexp_ratio_numerator(tmp2), 0);
    sexp_negate_exact(sexp_ratio_numerator(tmp2));
    r = sexp_ratio_add(ctx, a, tmp2);
    if (negatep) {
      sexp_negate_maybe_ratio(r);
    }
    break;
#endif
#if SEXP_USE_COMPLEX
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_CPX:
    a = tmp1 = sexp_make_flonum(ctx, sexp_ratio_to_double(ctx, a));
    goto complex_sub;
  case SEXP_NUM_CPX_RAT:
    b = tmp1 = sexp_make_flonum(ctx, sexp_ratio_to_double(ctx, b));
    /* ... FALLTHROUGH ... */
#endif
  case SEXP_NUM_CPX_FLO:
  case SEXP_NUM_CPX_FIX:
  case SEXP_NUM_CPX_BIG:
    tmp1 = a; a = b; b = tmp1;
    negatep = 1;
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_FLO_CPX:
  case SEXP_NUM_FIX_CPX:
  case SEXP_NUM_BIG_CPX:
    a = tmp1 = sexp_make_complex(ctx, a, SEXP_ZERO);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_CPX_CPX:
#if SEXP_USE_RATIOS
  complex_sub:
#endif
    r = sexp_complex_sub(ctx, a, b);
    if (negatep) {
      if (sexp_complexp(r)) {
        r = sexp_complex_copy(ctx, r);
        sexp_negate_maybe_ratio(sexp_complex_real(r));
        sexp_negate_maybe_ratio(sexp_complex_imag(r));
      } else {
        sexp_negate_maybe_ratio(r);
      }
    }
    break;
#endif
  }
  sexp_gc_release2(ctx);
  return r;
}